

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg_tracing_helpers.hpp
# Opt level: O3

void so_5::impl::msg_tracing_helpers::details::make_trace_to_1(ostream *s,message_ref_t *message)

{
  uint uVar1;
  message_t *pmVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  char *pcVar5;
  
  pmVar2 = message->m_obj;
  if (pmVar2 == (message_t *)0x0) {
LAB_001f6a3b:
    pcVar5 = "[signal]";
    lVar4 = 8;
  }
  else {
    iVar3 = (*pmVar2->_vptr_message_t[2])(pmVar2);
    if ((message_t *)CONCAT44(extraout_var,iVar3) != pmVar2) {
      std::__ostream_insert<char,std::char_traits<char>>(s,"[envelope_ptr=",0xe);
      uVar1 = *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18);
      *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) = uVar1 & 0xffffffb5 | 8;
      std::__ostream_insert<char,std::char_traits<char>>(s,"0x",2);
      std::ostream::_M_insert<long>((long)s);
      *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) =
           uVar1 & 0x4a | *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) & 0xffffffb5;
      std::__ostream_insert<char,std::char_traits<char>>(s,"]",1);
      if ((message_t *)CONCAT44(extraout_var,iVar3) == (message_t *)0x0) goto LAB_001f6a3b;
    }
    std::__ostream_insert<char,std::char_traits<char>>(s,"[payload_ptr=",0xd);
    uVar1 = *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18);
    *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) = uVar1 & 0xffffffb5 | 8;
    std::__ostream_insert<char,std::char_traits<char>>(s,"0x",2);
    std::ostream::_M_insert<long>((long)s);
    pcVar5 = "]";
    lVar4 = 1;
    *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) =
         uVar1 & 0x4a | *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) & 0xffffffb5;
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,pcVar5,lVar4);
  if (message->m_obj != (message_t *)0x0) {
    iVar3 = (*message->m_obj->_vptr_message_t[3])();
    if (iVar3 == 1) {
      std::__ostream_insert<char,std::char_traits<char>>(s,"[mutable]",9);
      return;
    }
  }
  return;
}

Assistant:

inline void
make_trace_to_1( std::ostream & s, const message_ref_t & message )
	{
		// The first pointer is a pointer to envelope.
		// The second pointer is a pointer to payload.
		using msg_pointers = std::tuple< const void *, const void * >;

		auto detect_pointers = [&message]() -> msg_pointers {
			if( const message_t * envelope = message.get() )
				{
					// We can try cases with service requests and user-type messages.
					const void * payload =
							internal_message_iface_t{ *envelope }.payload_ptr();

					if( payload != envelope )
						// There are an envelope and payload inside it.
						return msg_pointers{ envelope, payload };
					else
						// There is only payload.
						return msg_pointers{ nullptr, envelope };
				}
			else
				// It is a signal there is nothing.
				return msg_pointers{ nullptr, nullptr };
		};

		const void * envelope = nullptr;
		const void * payload = nullptr;

		std::tie(envelope,payload) = detect_pointers();

		if( envelope )
			s << "[envelope_ptr=" << pointer{envelope} << "]";
		if( payload )
			s << "[payload_ptr=" << pointer{payload} << "]";
		else
			s << "[signal]";
		if( message_mutability_t::mutable_message == message_mutability(message) )
			s << "[mutable]";
	}